

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall ON_Extrusion::IsPlanar(ON_Extrusion *this,ON_Plane *plane,double tolerance)

{
  ON_Line *this_00;
  bool bVar1;
  int iVar2;
  ON_3dVector *this_01;
  ON_3dVector N;
  ON_3dVector pathT;
  ON_3dVector X;
  ON_3dVector Y;
  ON_3dPoint Q0;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_3dPoint Q1;
  ON_3dVector local_128;
  ON_3dVector local_110;
  ON_3dVector local_f8;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  if ((this->m_profile != (ON_Curve *)0x0) &&
     (iVar2 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                        (SUB84(tolerance,0)), (char)iVar2 != '\0')) {
    if (plane == (ON_Plane *)0x0) {
      return true;
    }
    ON_Curve::PointAtStart(&local_78,this->m_profile);
    ON_Curve::PointAtEnd(&local_90,this->m_profile);
    this_00 = &this->m_path;
    ON_Line::Tangent(&local_f8,this_00);
    local_c8.z = (this->m_up).z;
    local_c8.x = (this->m_up).x;
    local_c8.y = (this->m_up).y;
    ON_CrossProduct(&local_e0,&local_c8,&local_f8);
    bVar1 = ON_3dVector::IsUnitVector(&local_e0);
    if (!bVar1) {
      ON_3dVector::Unitize(&local_e0);
    }
    ::operator*(&local_110,local_78.x,&local_e0);
    ON_3dPoint::operator+(&local_60,&this_00->from,&local_110);
    ::operator*(&local_128,local_78.y,&local_c8);
    ON_3dPoint::operator+(&local_a8,&local_60,&local_128);
    ::operator*(&local_128,local_90.x,&local_e0);
    ON_3dPoint::operator+((ON_3dPoint *)&local_110,&this_00->from,&local_128);
    ::operator*(&local_48,local_90.y,&local_c8);
    ON_3dPoint::operator+(&local_60,(ON_3dPoint *)&local_110,&local_48);
    ON_3dPoint::operator-(&local_128,&local_60,&local_a8);
    ON_CrossProduct(&local_110,&local_f8,&local_128);
    ON_3dVector::Unitize(&local_110);
    (plane->origin).z = local_a8.z;
    (plane->origin).x = local_a8.x;
    (plane->origin).y = local_a8.y;
    if (this->m_bTransposed == false) {
      (plane->yaxis).z = local_f8.z;
      (plane->yaxis).x = local_f8.x;
      (plane->yaxis).y = local_f8.y;
      ON_3dVector::operator-(&local_128,&local_110);
      (plane->zaxis).z = local_128.z;
      (plane->zaxis).x = local_128.x;
      (plane->zaxis).y = local_128.y;
      ON_CrossProduct(&local_128,&plane->yaxis,&plane->zaxis);
      this_01 = &plane->xaxis;
      (plane->xaxis).z = local_128.z;
      (plane->xaxis).x = local_128.x;
      (plane->xaxis).y = local_128.y;
    }
    else {
      (plane->xaxis).z = local_f8.z;
      (plane->xaxis).x = local_f8.x;
      (plane->xaxis).y = local_f8.y;
      (plane->zaxis).x = local_110.x;
      (plane->zaxis).y = local_110.y;
      (plane->zaxis).z = local_110.z;
      ON_CrossProduct(&local_128,&plane->zaxis,&plane->xaxis);
      this_01 = &plane->yaxis;
      (plane->yaxis).z = local_128.z;
      (plane->yaxis).x = local_128.x;
      (plane->yaxis).y = local_128.y;
    }
    ON_3dVector::Unitize(this_01);
    ON_Plane::UpdateEquation(plane);
    return true;
  }
  return false;
}

Assistant:

bool ON_Extrusion::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  if ( m_profile && m_profile->IsLinear(tolerance) )
  {
    if ( plane )
    {
      ON_3dPoint P0 = m_profile->PointAtStart();
      ON_3dPoint P1 = m_profile->PointAtEnd();
      ON_3dVector pathT = m_path.Tangent();
      ON_3dVector Y = m_up;
      ON_3dVector X = ON_CrossProduct(Y,pathT);
      if ( !X.IsUnitVector() )
        X.Unitize();
      ON_3dPoint Q0 = m_path.from + P0.x*X + P0.y*Y;
      ON_3dPoint Q1 = m_path.from + P1.x*X + P1.y*Y;
      ON_3dVector N = ON_CrossProduct(pathT,Q1-Q0);
      N.Unitize();
      plane->origin = Q0;
      if ( false == m_bTransposed )
      {
        plane->yaxis = pathT;
        plane->zaxis = -N;
        plane->xaxis = ON_CrossProduct(plane->yaxis,plane->zaxis);
        plane->xaxis.Unitize();
      }
      else
      {
        plane->xaxis = pathT;
        plane->zaxis = N;
        plane->yaxis = ON_CrossProduct(plane->zaxis,plane->xaxis);
        plane->yaxis.Unitize();
      }
      plane->UpdateEquation();
    }    
    return true;
  }
  return false;
}